

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QtPrivate::QCalendarModel::setWeekNumbersShown(QCalendarModel *this,bool show)

{
  long in_FS_OFFSET;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_weekNumbersShown != show) {
    this->m_weekNumbersShown = show;
    if (show) {
      local_28 = 0xffffffffffffffff;
      local_20 = 0;
      uStack_18 = 0;
      QAbstractItemModel::beginInsertColumns((QModelIndex *)this,(int)&local_28,0);
      this->m_firstColumn = 1;
      QAbstractItemModel::endInsertColumns();
    }
    else {
      local_28 = 0xffffffffffffffff;
      local_20 = 0;
      uStack_18 = 0;
      QAbstractItemModel::beginRemoveColumns((QModelIndex *)this,(int)&local_28,0);
      this->m_firstColumn = 0;
      QAbstractItemModel::endRemoveColumns();
    }
    internalUpdate(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarModel::setWeekNumbersShown(bool show)
{
    if (m_weekNumbersShown == show)
        return;

    m_weekNumbersShown = show;
    if (show) {
        beginInsertColumns(QModelIndex(), 0, 0);
        m_firstColumn = 1;
        endInsertColumns();
    } else {
        beginRemoveColumns(QModelIndex(), 0, 0);
        m_firstColumn = 0;
        endRemoveColumns();
    }
    internalUpdate();
}